

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cEnhancedLayoutsTests.cpp
# Opt level: O0

string * __thiscall
gl4cts::EnhancedLayouts::Utils::GetDefinitions_abi_cxx11_
          (string *__return_storage_ptr__,Utils *this,PtrVector *vector,FLAVOUR flavour)

{
  ulong uVar1;
  size_type sVar2;
  const_reference ppVVar3;
  GLchar *element;
  string local_60;
  uint local_3c;
  size_t sStack_38;
  GLuint i;
  size_t position;
  allocator<char> local_1e;
  undefined1 local_1d;
  FLAVOUR local_1c;
  Utils *pUStack_18;
  FLAVOUR flavour_local;
  PtrVector *vector_local;
  string *list;
  
  local_1c = (FLAVOUR)vector;
  local_1d = 0;
  pUStack_18 = this;
  vector_local = (PtrVector *)__return_storage_ptr__;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)__return_storage_ptr__,"LIST",&local_1e);
  std::allocator<char>::~allocator(&local_1e);
  sStack_38 = 0;
  for (local_3c = 0; uVar1 = (ulong)local_3c,
      sVar2 = std::
              vector<gl4cts::EnhancedLayouts::Utils::Variable_*,_std::allocator<gl4cts::EnhancedLayouts::Utils::Variable_*>_>
              ::size((vector<gl4cts::EnhancedLayouts::Utils::Variable_*,_std::allocator<gl4cts::EnhancedLayouts::Utils::Variable_*>_>
                      *)pUStack_18), uVar1 < sVar2; local_3c = local_3c + 1) {
    ppVVar3 = std::
              vector<gl4cts::EnhancedLayouts::Utils::Variable_*,_std::allocator<gl4cts::EnhancedLayouts::Utils::Variable_*>_>
              ::operator[]((vector<gl4cts::EnhancedLayouts::Utils::Variable_*,_std::allocator<gl4cts::EnhancedLayouts::Utils::Variable_*>_>
                            *)pUStack_18,(ulong)local_3c);
    Variable::GetDefinition_abi_cxx11_(&local_60,*ppVVar3,local_1c);
    element = (GLchar *)std::__cxx11::string::c_str();
    insertElementOfList(element,"\n",&stack0xffffffffffffffc8,__return_storage_ptr__);
    std::__cxx11::string::~string((string *)&local_60);
  }
  endList("",&stack0xffffffffffffffc8,__return_storage_ptr__);
  return __return_storage_ptr__;
}

Assistant:

std::string GetDefinitions(const Variable::PtrVector& vector, Variable::FLAVOUR flavour)
{
	std::string list	 = Utils::g_list;
	size_t		position = 0;

	for (GLuint i = 0; i < vector.size(); ++i)
	{
		Utils::insertElementOfList(vector[i]->GetDefinition(flavour).c_str(), "\n", position, list);
	}

	Utils::endList("", position, list);

	return list;
}